

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::BinaryLambdaWrapper,bool,duckdb::timestamp_t(*)(duckdb::interval_t,duckdb::timestamp_t),false,false>
               (interval_t *ldata,timestamp_t *rdata,timestamp_t *result_data,idx_t count,
               ValidityMask *mask,_func_timestamp_t_interval_t_timestamp_t *fun)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  unsigned_long *puVar4;
  ulong uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  timestamp_t tVar9;
  ulong uVar10;
  int64_t *piVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  idx_t iVar15;
  interval_t iVar16;
  interval_t iVar17;
  interval_t iVar18;
  ulong local_68;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      piVar11 = &ldata->micros;
      iVar15 = 0;
      do {
        uVar3 = ((interval_t *)(piVar11 + -1))->months;
        uVar8 = ((interval_t *)(piVar11 + -1))->days;
        iVar18.days = uVar8;
        iVar18.months = uVar3;
        iVar18.micros = *piVar11;
        tVar9 = (*fun)(iVar18,rdata[iVar15].value);
        result_data[iVar15].value = tVar9.value;
        iVar15 = iVar15 + 1;
        piVar11 = piVar11 + 2;
      } while (count != iVar15);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_68 = 0;
    uVar14 = 0;
    do {
      puVar4 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar4 == (unsigned_long *)0x0) {
        uVar12 = uVar14 + 0x40;
        if (count <= uVar14 + 0x40) {
          uVar12 = count;
        }
LAB_01a1a06a:
        uVar13 = uVar14;
        if (uVar14 < uVar12) {
          piVar11 = &ldata[uVar14].micros;
          do {
            uVar1 = ((interval_t *)(piVar11 + -1))->months;
            uVar6 = ((interval_t *)(piVar11 + -1))->days;
            iVar16.days = uVar6;
            iVar16.months = uVar1;
            iVar16.micros = *piVar11;
            tVar9 = (*fun)(iVar16,rdata[uVar14].value);
            result_data[uVar14].value = tVar9.value;
            uVar14 = uVar14 + 1;
            piVar11 = piVar11 + 2;
            uVar13 = uVar12;
          } while (uVar12 != uVar14);
        }
      }
      else {
        uVar5 = puVar4[local_68];
        uVar12 = uVar14 + 0x40;
        if (count <= uVar14 + 0x40) {
          uVar12 = count;
        }
        uVar13 = uVar12;
        if (uVar5 != 0) {
          if (uVar5 == 0xffffffffffffffff) goto LAB_01a1a06a;
          uVar13 = uVar14;
          if (uVar14 < uVar12) {
            piVar11 = &ldata[uVar14].micros;
            uVar10 = 0;
            do {
              if ((uVar5 >> (uVar10 & 0x3f) & 1) != 0) {
                uVar2 = ((interval_t *)(piVar11 + -1))->months;
                uVar7 = ((interval_t *)(piVar11 + -1))->days;
                iVar17.days = uVar7;
                iVar17.months = uVar2;
                iVar17.micros = *piVar11;
                tVar9 = (*fun)(iVar17,rdata[uVar14 + uVar10].value);
                result_data[uVar14 + uVar10].value = tVar9.value;
              }
              uVar10 = uVar10 + 1;
              piVar11 = piVar11 + 2;
              uVar13 = uVar12;
            } while (uVar12 - uVar14 != uVar10);
          }
        }
      }
      local_68 = local_68 + 1;
      uVar14 = uVar13;
    } while (local_68 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}